

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int openDatabase(char *zFilename,sqlite3 **ppDb,uint flags,char *zVfs)

{
  int *piVar1;
  Db *pDVar2;
  Btree *p;
  char *p_00;
  int iVar3;
  uint uVar4;
  sqlite3 *db;
  sqlite3_mutex *psVar5;
  HashElem *pHVar6;
  Schema *pSVar7;
  char *zFormat;
  uint uVar8;
  sqlite3 **ppsVar9;
  int err_code;
  bool bVar10;
  char *zOpen;
  char *zErrMsg;
  uint local_54;
  sqlite3 **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  *ppDb = (sqlite3 *)0x0;
  local_54 = flags;
  iVar3 = sqlite3_initialize();
  if (iVar3 != 0) {
    return iVar3;
  }
  bVar10 = true;
  if ((-1 < (short)flags) && (sqlite3Config.bCoreMutex != 0)) {
    if ((flags >> 0x10 & 1) == 0) {
      bVar10 = sqlite3Config.bFullMutex == 0;
    }
    else {
      bVar10 = false;
    }
  }
  if ((flags >> 0x12 & 1) == 0) {
    if (sqlite3Config.sharedCacheEnabled != 0) {
      local_54 = flags | 0x20000;
    }
  }
  else {
    local_54 = flags & 0xfffdffff;
  }
  uVar4 = local_54;
  uVar8 = local_54 & 0xfff600e7;
  local_54 = uVar8;
  local_50 = ppDb;
  local_38 = zVfs;
  db = (sqlite3 *)sqlite3Malloc(0x2a0);
  if (db == (sqlite3 *)0x0) {
LAB_00121e53:
    db = (sqlite3 *)0x0;
    ppsVar9 = local_50;
  }
  else {
    memset(db,0,0x2a0);
    if (!bVar10) {
      if (sqlite3Config.bCoreMutex == 0) {
        psVar5 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(1);
      }
      db->mutex = psVar5;
      if (psVar5 == (sqlite3_mutex *)0x0) {
        sqlite3_free(db);
        goto LAB_00121e53;
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errMask = 0xff;
    db->nDb = 2;
    db->magic = 0xf03b7906;
    db->aDb = db->aDbStatic;
    db->aLimit[8] = 50000;
    db->aLimit[9] = 999;
    db->aLimit[10] = 1000;
    db->aLimit[0xb] = 8;
    db->aLimit[0] = 1000000000;
    db->aLimit[1] = 1000000000;
    db->aLimit[2] = 2000;
    db->aLimit[3] = 1000;
    db->aLimit[4] = 500;
    db->aLimit[5] = 250000000;
    db->aLimit[6] = 0x7f;
    db->aLimit[7] = 10;
    db->aLimit[0xb] = 0;
    db->autoCommit = '\x01';
    db->nextAutovac = -1;
    db->szMmap = sqlite3Config.szMmap;
    db->nextPagesize = 0;
    db->nMaxSorterMmap = 0x7fffffff;
    db->flags = db->flags | 0x28060;
    (db->aCollSeq).ht = (_ht *)0x0;
    (db->aCollSeq).htsize = 0;
    (db->aCollSeq).count = 0;
    (db->aCollSeq).first = (HashElem *)0x0;
    (db->aModule).ht = (_ht *)0x0;
    (db->aModule).htsize = 0;
    (db->aModule).count = 0;
    (db->aModule).first = (HashElem *)0x0;
    createCollation(db,"BINARY",'\x01',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
    createCollation(db,"BINARY",'\x03',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
    createCollation(db,"BINARY",'\x02',(void *)0x0,binCollFunc,(_func_void_void_ptr *)0x0);
    createCollation(db,"NOCASE",'\x01',(void *)0x0,nocaseCollatingFunc,(_func_void_void_ptr *)0x0);
    createCollation(db,"RTRIM",'\x01',(void *)0x1,binCollFunc,(_func_void_void_ptr *)0x0);
    ppsVar9 = local_50;
    if (db->mallocFailed == '\0') {
      pHVar6 = findElementWithHash(&db->aCollSeq,"BINARY",(uint *)0x0);
      db->pDfltColl = (CollSeq *)pHVar6->data;
      db->openFlags = uVar8;
      if ((0x46U >> (uVar4 & 7) & 1) == 0) {
        iVar3 = 0x15;
        sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x234a6);
      }
      else {
        iVar3 = sqlite3ParseUri(local_38,zFilename,&local_54,(sqlite3_vfs **)db,&local_48,&local_40)
        ;
      }
      p_00 = local_40;
      ppsVar9 = local_50;
      if (iVar3 == 0) {
        iVar3 = sqlite3BtreeOpen(db->pVfs,local_48,db,&db->aDb->pBt,0,local_54 | 0x100);
        if (iVar3 == 0) {
          sqlite3BtreeEnter(db->aDb->pBt);
          pSVar7 = sqlite3SchemaGet(db,db->aDb->pBt);
          pDVar2 = db->aDb;
          pDVar2->pSchema = pSVar7;
          if (db->mallocFailed == '\0') {
            db->enc = pSVar7->enc;
          }
          p = pDVar2->pBt;
          if (p->sharable != '\0') {
            piVar1 = &p->wantToLock;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              unlockBtreeMutex(p);
            }
          }
          pSVar7 = sqlite3SchemaGet(db,(Btree *)0x0);
          pDVar2 = db->aDb;
          pDVar2[1].pSchema = pSVar7;
          pDVar2->zDbSName = "main";
          pDVar2->safety_level = '\x03';
          pDVar2[1].zDbSName = "temp";
          pDVar2[1].safety_level = '\x01';
          db->magic = 0xa029a697;
          if (db->mallocFailed == '\0') {
            db->errCode = 0;
            if (db->pErr != (sqlite3_value *)0x0) {
              sqlite3ErrorFinish(db,0);
            }
            sqlite3RegisterPerConnectionBuiltinFunctions(db);
            iVar3 = sqlite3_errcode(db);
            if (iVar3 == 0) {
              sqlite3AutoLoadExtensions(db);
              iVar3 = sqlite3_errcode(db);
              if (iVar3 != 0) goto LAB_00121e5b;
              iVar3 = 0;
            }
            if (iVar3 != 0) {
              db->errCode = iVar3;
              sqlite3ErrorFinish(db,iVar3);
            }
            setupLookaside(db,(void *)0x0,sqlite3Config.szLookaside,sqlite3Config.nLookaside);
            if (db->mutex != (sqlite3_mutex *)0x0) {
              (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
            }
            db->xWalCallback = sqlite3WalDefaultHook;
            db->pWalArg = (void *)0x3e8;
            if (db->mutex != (sqlite3_mutex *)0x0) {
              (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
            }
          }
        }
        else {
          err_code = 7;
          if (iVar3 != 0xc0a) {
            err_code = iVar3;
          }
          db->errCode = err_code;
          sqlite3ErrorFinish(db,err_code);
        }
      }
      else {
        if (((iVar3 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
          db->mallocFailed = '\x01';
          if (0 < db->nVdbeExec) {
            (db->u1).isInterrupted = 1;
          }
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        zFormat = "%s";
        if (local_40 == (char *)0x0) {
          zFormat = (char *)0x0;
        }
        sqlite3ErrorWithMsg(db,iVar3,zFormat,local_40);
        sqlite3_free(p_00);
      }
    }
  }
LAB_00121e5b:
  if ((db != (sqlite3 *)0x0) && (db->mutex != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  uVar4 = sqlite3_errcode(db);
  if (uVar4 != 0) {
    if (uVar4 == 7) {
      sqlite3Close(db,0);
      db = (sqlite3 *)0x0;
    }
    else {
      db->magic = 0x4b771290;
    }
  }
  *ppsVar9 = db;
  sqlite3_free(local_48);
  return uVar4 & 0xff;
}

Assistant:

static int openDatabase(
  const char *zFilename, /* Database filename UTF-8 encoded */
  sqlite3 **ppDb,        /* OUT: Returned database handle */
  unsigned int flags,    /* Operational flags */
  const char *zVfs       /* Name of the VFS to use */
){
  sqlite3 *db;                    /* Store allocated handle here */
  int rc;                         /* Return code */
  int isThreadsafe;               /* True for threadsafe connections */
  char *zOpen = 0;                /* Filename argument to pass to BtreeOpen() */
  char *zErrMsg = 0;              /* Error message from sqlite3ParseUri() */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif

  if( sqlite3GlobalConfig.bCoreMutex==0 ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_NOMUTEX ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_FULLMUTEX ){
    isThreadsafe = 1;
  }else{
    isThreadsafe = sqlite3GlobalConfig.bFullMutex;
  }
  if( flags & SQLITE_OPEN_PRIVATECACHE ){
    flags &= ~SQLITE_OPEN_SHAREDCACHE;
  }else if( sqlite3GlobalConfig.sharedCacheEnabled ){
    flags |= SQLITE_OPEN_SHAREDCACHE;
  }

  /* Remove harmful bits from the flags parameter
  **
  ** The SQLITE_OPEN_NOMUTEX and SQLITE_OPEN_FULLMUTEX flags were
  ** dealt with in the previous code block.  Besides these, the only
  ** valid input flags for sqlite3_open_v2() are SQLITE_OPEN_READONLY,
  ** SQLITE_OPEN_READWRITE, SQLITE_OPEN_CREATE, SQLITE_OPEN_SHAREDCACHE,
  ** SQLITE_OPEN_PRIVATECACHE, and some reserved bits.  Silently mask
  ** off all other flags.
  */
  flags &=  ~( SQLITE_OPEN_DELETEONCLOSE |
               SQLITE_OPEN_EXCLUSIVE |
               SQLITE_OPEN_MAIN_DB |
               SQLITE_OPEN_TEMP_DB | 
               SQLITE_OPEN_TRANSIENT_DB | 
               SQLITE_OPEN_MAIN_JOURNAL | 
               SQLITE_OPEN_TEMP_JOURNAL | 
               SQLITE_OPEN_SUBJOURNAL | 
               SQLITE_OPEN_MASTER_JOURNAL |
               SQLITE_OPEN_NOMUTEX |
               SQLITE_OPEN_FULLMUTEX |
               SQLITE_OPEN_WAL
             );

  /* Allocate the sqlite data structure */
  db = sqlite3MallocZero( sizeof(sqlite3) );
  if( db==0 ) goto opendb_out;
  if( isThreadsafe ){
    db->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_RECURSIVE);
    if( db->mutex==0 ){
      sqlite3_free(db);
      db = 0;
      goto opendb_out;
    }
  }
  sqlite3_mutex_enter(db->mutex);
  db->errMask = 0xff;
  db->nDb = 2;
  db->magic = SQLITE_MAGIC_BUSY;
  db->aDb = db->aDbStatic;

  assert( sizeof(db->aLimit)==sizeof(aHardLimit) );
  memcpy(db->aLimit, aHardLimit, sizeof(db->aLimit));
  db->aLimit[SQLITE_LIMIT_WORKER_THREADS] = SQLITE_DEFAULT_WORKER_THREADS;
  db->autoCommit = 1;
  db->nextAutovac = -1;
  db->szMmap = sqlite3GlobalConfig.szMmap;
  db->nextPagesize = 0;
  db->nMaxSorterMmap = 0x7FFFFFFF;
  db->flags |= SQLITE_ShortColNames | SQLITE_EnableTrigger | SQLITE_CacheSpill
#if !defined(SQLITE_DEFAULT_AUTOMATIC_INDEX) || SQLITE_DEFAULT_AUTOMATIC_INDEX
                 | SQLITE_AutoIndex
#endif
#if SQLITE_DEFAULT_CKPTFULLFSYNC
                 | SQLITE_CkptFullFSync
#endif
#if SQLITE_DEFAULT_FILE_FORMAT<4
                 | SQLITE_LegacyFileFmt
#endif
#ifdef SQLITE_ENABLE_LOAD_EXTENSION
                 | SQLITE_LoadExtension
#endif
#if SQLITE_DEFAULT_RECURSIVE_TRIGGERS
                 | SQLITE_RecTriggers
#endif
#if defined(SQLITE_DEFAULT_FOREIGN_KEYS) && SQLITE_DEFAULT_FOREIGN_KEYS
                 | SQLITE_ForeignKeys
#endif
#if defined(SQLITE_REVERSE_UNORDERED_SELECTS)
                 | SQLITE_ReverseOrder
#endif
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
                 | SQLITE_CellSizeCk
#endif
#if defined(SQLITE_ENABLE_FTS3_TOKENIZER)
                 | SQLITE_Fts3Tokenizer
#endif
#if defined(SQLITE_ENABLE_QPSG)
                 | SQLITE_EnableQPSG
#endif
      ;
  sqlite3HashInit(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3HashInit(&db->aModule);
#endif

  /* Add the default collation sequence BINARY. BINARY works for both UTF-8
  ** and UTF-16, so add a version for each to avoid any unnecessary
  ** conversions. The only error that can occur here is a malloc() failure.
  **
  ** EVIDENCE-OF: R-52786-44878 SQLite defines three built-in collating
  ** functions:
  */
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF8, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16BE, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16LE, 0, binCollFunc, 0);
  createCollation(db, "NOCASE", SQLITE_UTF8, 0, nocaseCollatingFunc, 0);
  createCollation(db, "RTRIM", SQLITE_UTF8, (void*)1, binCollFunc, 0);
  if( db->mallocFailed ){
    goto opendb_out;
  }
  /* EVIDENCE-OF: R-08308-17224 The default collating function for all
  ** strings is BINARY. 
  */
  db->pDfltColl = sqlite3FindCollSeq(db, SQLITE_UTF8, sqlite3StrBINARY, 0);
  assert( db->pDfltColl!=0 );

  /* Parse the filename/URI argument
  **
  ** Only allow sensible combinations of bits in the flags argument.  
  ** Throw an error if any non-sense combination is used.  If we
  ** do not block illegal combinations here, it could trigger
  ** assert() statements in deeper layers.  Sensible combinations
  ** are:
  **
  **  1:  SQLITE_OPEN_READONLY
  **  2:  SQLITE_OPEN_READWRITE
  **  6:  SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE
  */
  db->openFlags = flags;
  assert( SQLITE_OPEN_READONLY  == 0x01 );
  assert( SQLITE_OPEN_READWRITE == 0x02 );
  assert( SQLITE_OPEN_CREATE    == 0x04 );
  testcase( (1<<(flags&7))==0x02 ); /* READONLY */
  testcase( (1<<(flags&7))==0x04 ); /* READWRITE */
  testcase( (1<<(flags&7))==0x40 ); /* READWRITE | CREATE */
  if( ((1<<(flags&7)) & 0x46)==0 ){
    rc = SQLITE_MISUSE_BKPT;  /* IMP: R-65497-44594 */
  }else{
    rc = sqlite3ParseUri(zVfs, zFilename, &flags, &db->pVfs, &zOpen, &zErrMsg);
  }
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3ErrorWithMsg(db, rc, zErrMsg ? "%s" : 0, zErrMsg);
    sqlite3_free(zErrMsg);
    goto opendb_out;
  }

  /* Open the backend database driver */
  rc = sqlite3BtreeOpen(db->pVfs, zOpen, db, &db->aDb[0].pBt, 0,
                        flags | SQLITE_OPEN_MAIN_DB);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    sqlite3Error(db, rc);
    goto opendb_out;
  }
  sqlite3BtreeEnter(db->aDb[0].pBt);
  db->aDb[0].pSchema = sqlite3SchemaGet(db, db->aDb[0].pBt);
  if( !db->mallocFailed ) ENC(db) = SCHEMA_ENC(db);
  sqlite3BtreeLeave(db->aDb[0].pBt);
  db->aDb[1].pSchema = sqlite3SchemaGet(db, 0);

  /* The default safety_level for the main database is FULL; for the temp
  ** database it is OFF. This matches the pager layer defaults.  
  */
  db->aDb[0].zDbSName = "main";
  db->aDb[0].safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  db->aDb[1].zDbSName = "temp";
  db->aDb[1].safety_level = PAGER_SYNCHRONOUS_OFF;

  db->magic = SQLITE_MAGIC_OPEN;
  if( db->mallocFailed ){
    goto opendb_out;
  }

  /* Register all built-in functions, but do not attempt to read the
  ** database schema yet. This is delayed until the first time the database
  ** is accessed.
  */
  sqlite3Error(db, SQLITE_OK);
  sqlite3RegisterPerConnectionBuiltinFunctions(db);
  rc = sqlite3_errcode(db);

#ifdef SQLITE_ENABLE_FTS5
  /* Register any built-in FTS5 module before loading the automatic
  ** extensions. This allows automatic extensions to register FTS5 
  ** tokenizers and auxiliary functions.  */
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3Fts5Init(db);
  }
#endif

  /* Load automatic extensions - extensions that have been registered
  ** using the sqlite3_automatic_extension() API.
  */
  if( rc==SQLITE_OK ){
    sqlite3AutoLoadExtensions(db);
    rc = sqlite3_errcode(db);
    if( rc!=SQLITE_OK ){
      goto opendb_out;
    }
  }

#ifdef SQLITE_ENABLE_FTS1
  if( !db->mallocFailed ){
    extern int sqlite3Fts1Init(sqlite3*);
    rc = sqlite3Fts1Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_FTS2
  if( !db->mallocFailed && rc==SQLITE_OK ){
    extern int sqlite3Fts2Init(sqlite3*);
    rc = sqlite3Fts2Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_FTS3 /* automatically defined by SQLITE_ENABLE_FTS4 */
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3Fts3Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_ICU
  if( !db->mallocFailed && rc==SQLITE_OK ){
    rc = sqlite3IcuInit(db);
  }
#endif

#ifdef SQLITE_ENABLE_RTREE
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3RtreeInit(db);
  }
#endif

#ifdef SQLITE_ENABLE_DBSTAT_VTAB
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3DbstatRegister(db);
  }
#endif

#ifdef SQLITE_ENABLE_JSON1
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3Json1Init(db);
  }
#endif

#ifdef SQLITE_ENABLE_STMTVTAB
  if( !db->mallocFailed && rc==SQLITE_OK){
    rc = sqlite3StmtVtabInit(db);
  }
#endif

  /* -DSQLITE_DEFAULT_LOCKING_MODE=1 makes EXCLUSIVE the default locking
  ** mode.  -DSQLITE_DEFAULT_LOCKING_MODE=0 make NORMAL the default locking
  ** mode.  Doing nothing at all also makes NORMAL the default.
  */
#ifdef SQLITE_DEFAULT_LOCKING_MODE
  db->dfltLockMode = SQLITE_DEFAULT_LOCKING_MODE;
  sqlite3PagerLockingMode(sqlite3BtreePager(db->aDb[0].pBt),
                          SQLITE_DEFAULT_LOCKING_MODE);
#endif

  if( rc ) sqlite3Error(db, rc);

  /* Enable the lookaside-malloc subsystem */
  setupLookaside(db, 0, sqlite3GlobalConfig.szLookaside,
                        sqlite3GlobalConfig.nLookaside);

  sqlite3_wal_autocheckpoint(db, SQLITE_DEFAULT_WAL_AUTOCHECKPOINT);

opendb_out:
  if( db ){
    assert( db->mutex!=0 || isThreadsafe==0
           || sqlite3GlobalConfig.bFullMutex==0 );
    sqlite3_mutex_leave(db->mutex);
  }
  rc = sqlite3_errcode(db);
  assert( db!=0 || rc==SQLITE_NOMEM );
  if( rc==SQLITE_NOMEM ){
    sqlite3_close(db);
    db = 0;
  }else if( rc!=SQLITE_OK ){
    db->magic = SQLITE_MAGIC_SICK;
  }
  *ppDb = db;
#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Opening a db handle. Fourth parameter is passed 0. */
    void *pArg = sqlite3GlobalConfig.pSqllogArg;
    sqlite3GlobalConfig.xSqllog(pArg, db, zFilename, 0);
  }
#endif
#if defined(SQLITE_HAS_CODEC)
  if( rc==SQLITE_OK ){
    const char *zKey;
    if( (zKey = sqlite3_uri_parameter(zOpen, "hexkey"))!=0 && zKey[0] ){
      u8 iByte;
      int i;
      char zDecoded[40];
      for(i=0, iByte=0; i<sizeof(zDecoded)*2 && sqlite3Isxdigit(zKey[i]); i++){
        iByte = (iByte<<4) + sqlite3HexToInt(zKey[i]);
        if( (i&1)!=0 ) zDecoded[i/2] = iByte;
      }
      sqlite3_key_v2(db, 0, zDecoded, i/2);
    }else if( (zKey = sqlite3_uri_parameter(zOpen, "key"))!=0 ){
      sqlite3_key_v2(db, 0, zKey, sqlite3Strlen30(zKey));
    }
  }
#endif
  sqlite3_free(zOpen);
  return rc & 0xff;
}